

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_view.hpp
# Opt level: O0

int __thiscall protozero::data_view::compare(data_view *this,data_view other)

{
  char *__s1;
  char *__s2;
  unsigned_long *puVar1;
  size_t sVar2;
  size_t sVar3;
  size_t local_40;
  size_t local_38;
  int local_2c;
  data_view *pdStack_28;
  int cmp;
  data_view *this_local;
  data_view other_local;
  
  other_local.m_data = (char *)other.m_size;
  this_local = (data_view *)other.m_data;
  pdStack_28 = this;
  if (this->m_data == (char *)0x0 || this_local == (data_view *)0x0) {
    __assert_fail("m_data && other.m_data",
                  "/workspace/llm4binary/github/license_c_cmakelists/mapbox[P]protozero/include/protozero/data_view.hpp"
                  ,0x91,"int protozero::data_view::compare(data_view) const");
  }
  __s1 = data(this);
  __s2 = data((data_view *)&this_local);
  local_38 = size(this);
  local_40 = size((data_view *)&this_local);
  puVar1 = Catch::clara::std::min<unsigned_long>(&local_38,&local_40);
  local_2c = memcmp(__s1,__s2,*puVar1);
  other_local.m_size._4_4_ = local_2c;
  if (local_2c == 0) {
    sVar2 = size(this);
    sVar3 = size((data_view *)&this_local);
    if (sVar2 == sVar3) {
      other_local.m_size._4_4_ = 0;
    }
    else {
      sVar2 = size(this);
      sVar3 = size((data_view *)&this_local);
      other_local.m_size._4_4_ = 1;
      if (sVar2 < sVar3) {
        other_local.m_size._4_4_ = -1;
      }
    }
  }
  return other_local.m_size._4_4_;
}

Assistant:

int compare(data_view other) const noexcept {
        assert(m_data && other.m_data);
        const int cmp = std::memcmp(data(), other.data(),
                                    std::min(size(), other.size()));
        if (cmp == 0) {
            if (size() == other.size()) {
                return 0;
            }
            return size() < other.size() ? -1 : 1;
        }
        return cmp;
    }